

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

HashEntry * raviX_hash_table_insert_pre_hashed(HashTable *ht,uint32_t hash,void *key,void *data)

{
  HashEntry *pHVar1;
  uint32_t *puVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t new_size_index;
  HashEntry *pHVar7;
  
  if (ht->entries < ht->max_entries) {
    if (ht->entries + ht->deleted_entries < ht->max_entries) goto LAB_0010cb42;
    new_size_index = ht->size_index;
  }
  else {
    new_size_index = ht->size_index + 1;
  }
  hash_table_rehash(ht,new_size_index);
LAB_0010cb42:
  uVar5 = ht->size;
  pHVar7 = (HashEntry *)0x0;
  uVar3 = (ulong)uVar5;
  uVar6 = (ulong)hash % uVar3;
  do {
    puVar2 = (uint32_t *)ht->table[uVar6].key;
    pHVar1 = ht->table + uVar6;
    if (puVar2 == (uint32_t *)0x0 || puVar2 == &deleted_key_value) {
      if (pHVar7 == (HashEntry *)0x0) {
        pHVar7 = pHVar1;
      }
      if (puVar2 == (uint32_t *)0x0) break;
    }
    if ((puVar2 != &deleted_key_value) && (pHVar1->hash == hash)) {
      iVar4 = (*ht->key_equals_function)(key,puVar2);
      if (iVar4 != 0) {
        pHVar1->key = key;
        pHVar1->data = data;
        return pHVar1;
      }
      uVar5 = ht->size;
    }
    uVar6 = (ulong)((int)uVar6 + 1 + hash % ht->rehash) % (ulong)uVar5;
  } while ((int)uVar6 != (int)((ulong)hash % uVar3));
  if (pHVar7 == (HashEntry *)0x0) {
    pHVar7 = (HashEntry *)0x0;
  }
  else {
    if ((uint32_t *)pHVar7->key == &deleted_key_value) {
      ht->deleted_entries = ht->deleted_entries - 1;
    }
    pHVar7->hash = hash;
    pHVar7->key = key;
    pHVar7->data = data;
    ht->entries = ht->entries + 1;
  }
  return pHVar7;
}

Assistant:

HashEntry *
raviX_hash_table_insert_pre_hashed(HashTable *ht, uint32_t hash,
			     const void *key, void *data)
{
	uint32_t start_hash_address, hash_address;
	HashEntry *available_entry = NULL;

	if (ht->entries >= ht->max_entries) {
		hash_table_rehash(ht, ht->size_index + 1);
	} else if (ht->deleted_entries + ht->entries >= ht->max_entries) {
		hash_table_rehash(ht, ht->size_index);
	}

	start_hash_address = hash % ht->size;
	hash_address = start_hash_address;
	do {
		HashEntry *entry = ht->table + hash_address;
		uint32_t double_hash;

		if (!entry_is_present(entry)) {
			/* Stash the first available entry we find */
			if (available_entry == NULL)
				available_entry = entry;
			if (entry_is_free(entry))
				break;
		}

		/* Implement replacement when another insert happens
		 * with a matching key.  This is a relatively common
		 * feature of hash tables, with the alternative
		 * generally being "insert the new value as well, and
		 * return it first when the key is searched for".
		 *
		 * Note that the hash table doesn't have a delete
		 * callback.  If freeing of old data pointers is
		 * required to avoid memory leaks, perform a search
		 * before inserting.
		 */
		if (!entry_is_deleted(entry) &&
		    entry->hash == hash &&
		    ht->key_equals_function(key, entry->key)) {
			entry->key = key;
			entry->data = data;
			return entry;
		}


		double_hash = 1 + hash % ht->rehash;

		hash_address = (hash_address + double_hash) % ht->size;
	} while (hash_address != start_hash_address);

	if (available_entry) {
		if (entry_is_deleted(available_entry))
			ht->deleted_entries--;
		available_entry->hash = hash;
		available_entry->key = key;
		available_entry->data = data;
		ht->entries++;
		return available_entry;
	}

	/* We could hit here if a required resize failed. An unchecked-malloc
	 * application could ignore this result.
	 */
	return NULL;
}